

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

AssertionExpr *
slang::ast::SimpleAssertionExpr::fromSyntax
          (SimpleSequenceExprSyntax *syntax,ASTContext *context,bool allowDisable)

{
  Compilation *this;
  SyntaxNode *this_00;
  bool bVar1;
  int iVar2;
  Expression *expr;
  Diagnostic *this_01;
  SourceLocation SVar3;
  SimpleAssertionExpr *pSVar4;
  DiagCode code;
  AssertionInstanceExpression *aie;
  SourceRange SVar5;
  bool local_6d;
  optional<slang::ast::SequenceRepetition> repetition;
  ConstantValue evaluatedValue;
  
  this = ((context->scope).ptr)->compilation;
  expr = bindExpr((syntax->expr).ptr,context,true,true);
  repetition.super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRepetition>._M_engaged = false;
  if (syntax->repetition == (SequenceRepetitionSyntax *)0x0) {
    if (expr->kind == AssertionInstance && !allowDisable) {
      SVar3 = (SourceLocation)expr[1].type.ptr;
      iVar2 = *(int *)SVar3;
      if (iVar2 == 7) {
        SVar3 = *(SourceLocation *)((long)SVar3 + 0x18);
        iVar2 = *(int *)SVar3;
      }
      if (iVar2 == 0xc) {
        SVar5 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        this_01 = ASTContext::addDiag(context,(DiagCode)0x2d0008,SVar5);
        Diagnostic::operator<<(this_01,*(string_view *)(*(long *)(expr + 1) + 8));
        this_00 = (SyntaxNode *)((string_view *)((long)SVar3 + 8))->_M_len;
        if (this_00 != (SyntaxNode *)0x0) {
          evaluatedValue.value.
          super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          .
          super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ._M_u._M_rest._0_16_ = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(this_00)
          ;
          SVar3 = parsing::Token::location((Token *)&evaluatedValue);
          Diagnostic::addNote(this_01,(DiagCode)0x50001,SVar3);
        }
      }
    }
  }
  else {
    std::optional<slang::ast::SequenceRepetition>::
    emplace<slang::syntax::SequenceRepetitionSyntax&,slang::ast::ASTContext_const&>
              (&repetition,syntax->repetition,context);
    if (expr->kind == AssertionInstance) {
      bVar1 = Type::isPropertyType((expr->type).ptr);
      if (bVar1) {
        SVar5 = slang::syntax::SyntaxNode::sourceRange(&syntax->repetition->super_SyntaxNode);
        code.subsystem = Statements;
        code.code = 0x36;
      }
      else {
        if (repetition.super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ast::SequenceRepetition>._M_payload._M_value.kind ==
            Consecutive) goto LAB_0061249f;
        SVar5 = slang::syntax::SyntaxNode::sourceRange(&syntax->repetition->super_SyntaxNode);
        code.subsystem = Statements;
        code.code = 0x44;
      }
      ASTContext::addDiag(context,code,SVar5);
    }
  }
LAB_0061249f:
  ASTContext::tryEval(&evaluatedValue,context,expr);
  local_6d = ConstantValue::isFalse(&evaluatedValue);
  pSVar4 = BumpAllocator::
           emplace<slang::ast::SimpleAssertionExpr,slang::ast::Expression_const&,std::optional<slang::ast::SequenceRepetition>&,bool>
                     (&this->super_BumpAllocator,expr,&repetition,&local_6d);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&evaluatedValue);
  return &pSVar4->super_AssertionExpr;
}

Assistant:

AssertionExpr& SimpleAssertionExpr::fromSyntax(const SimpleSequenceExprSyntax& syntax,
                                               const ASTContext& context, bool allowDisable) {
    auto& comp = context.getCompilation();
    auto& expr = bindExpr(*syntax.expr, context, /* allowInstances */ true);

    std::optional<SequenceRepetition> repetition;
    if (syntax.repetition) {
        repetition.emplace(*syntax.repetition, context);

        if (expr.kind == ExpressionKind::AssertionInstance) {
            if (expr.type->isPropertyType())
                context.addDiag(diag::PropInstanceRepetition, syntax.repetition->sourceRange());
            else if (repetition->kind != SequenceRepetition::Consecutive)
                context.addDiag(diag::SeqInstanceRepetition, syntax.repetition->sourceRange());
        }
    }
    else if (expr.kind == ExpressionKind::AssertionInstance && !allowDisable) {
        auto& aie = expr.as<AssertionInstanceExpression>();
        auto targetExpr = &aie.body;
        if (targetExpr->kind == AssertionExprKind::Clocking)
            targetExpr = &targetExpr->as<ClockingAssertionExpr>().expr;

        if (targetExpr->kind == AssertionExprKind::DisableIff) {
            auto& diag = context.addDiag(diag::NestedDisableIff, syntax.sourceRange());
            diag << aie.symbol.name;

            if (targetExpr->syntax) {
                diag.addNote(diag::NoteDeclarationHere,
                             targetExpr->syntax->getFirstToken().location());
            }
        }
    }

    const auto evaluatedValue = context.tryEval(expr);
    return *comp.emplace<SimpleAssertionExpr>(expr, repetition, evaluatedValue.isFalse());
}